

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_tcp_socket.c
# Opt level: O0

ssize_t amqp_tcp_socket_recv(void *base,void *buf,size_t len,int flags)

{
  int iVar1;
  int in_ECX;
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  ssize_t ret;
  amqp_tcp_socket_t *self;
  ssize_t local_38;
  ssize_t local_8;
  
  if (*(int *)(in_RDI + 8) == -1) {
    local_8 = -0x11;
  }
  else {
    do {
      local_38 = recv(*(int *)(in_RDI + 8),in_RSI,in_RDX,in_ECX);
      if (-1 < local_38) {
        if (local_38 == 0) {
          local_38 = -7;
        }
        goto LAB_001177f2;
      }
      iVar1 = amqp_os_socket_error();
      *(int *)(in_RDI + 0xc) = iVar1;
    } while (*(int *)(in_RDI + 0xc) == 4);
    if (*(int *)(in_RDI + 0xc) == 0xb) {
      local_38 = -0x1301;
    }
    else {
      local_38 = -9;
    }
LAB_001177f2:
    local_8 = local_38;
  }
  return local_8;
}

Assistant:

static ssize_t amqp_tcp_socket_recv(void *base, void *buf, size_t len,
                                    int flags) {
  struct amqp_tcp_socket_t *self = (struct amqp_tcp_socket_t *)base;
  ssize_t ret;
  if (-1 == self->sockfd) {
    return AMQP_STATUS_SOCKET_CLOSED;
  }

start:
#ifdef _WIN32
  ret = recv(self->sockfd, buf, (int)len, flags);
#else
  ret = recv(self->sockfd, buf, len, flags);
#endif

  if (0 > ret) {
    self->internal_error = amqp_os_socket_error();
    switch (self->internal_error) {
      case EINTR:
        goto start;
#ifdef _WIN32
      case WSAEWOULDBLOCK:
#else
      case EWOULDBLOCK:
#endif
#if defined(EAGAIN) && EAGAIN != EWOULDBLOCK
      case EAGAIN:
#endif
        ret = AMQP_PRIVATE_STATUS_SOCKET_NEEDREAD;
        break;
      default:
        ret = AMQP_STATUS_SOCKET_ERROR;
    }
  } else if (0 == ret) {
    ret = AMQP_STATUS_CONNECTION_CLOSED;
  }

  return ret;
}